

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emptytableref.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::EmptyTableRef::Copy(EmptyTableRef *this)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x68);
  *(undefined1 *)(pp_Var1 + 1) = 8;
  pp_Var1[2] = (_func_int *)(pp_Var1 + 4);
  pp_Var1[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 4) = 0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0xffffffffffffffff;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__TableRef_01982330;
  (this->super_TableRef)._vptr_TableRef = pp_Var1;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> EmptyTableRef::Copy() {
	return make_uniq<EmptyTableRef>();
}